

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O0

bool compareInfo(DataFieldInfo *info1,DataFieldInfo *info2)

{
  int iVar1;
  int iVar2;
  string *psVar3;
  string *__rhs;
  ostream *poVar4;
  void *pvVar5;
  bool local_19;
  bool equal;
  DataFieldInfo *info2_local;
  DataFieldInfo *info1_local;
  
  psVar3 = ser::DataFieldInfo::type_abi_cxx11_(info1);
  __rhs = ser::DataFieldInfo::type_abi_cxx11_(info2);
  local_19 = std::operator!=(psVar3,__rhs);
  if (local_19) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Type: ");
    psVar3 = ser::DataFieldInfo::type_abi_cxx11_(info1);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = std::operator<<(poVar4," != ");
    psVar3 = ser::DataFieldInfo::type_abi_cxx11_(info2);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  local_19 = !local_19;
  iVar1 = ser::DataFieldInfo::rank(info1);
  iVar2 = ser::DataFieldInfo::rank(info2);
  if (iVar1 != iVar2) {
    local_19 = false;
    poVar4 = std::operator<<((ostream *)&std::cout,"Rank: ");
    iVar1 = ser::DataFieldInfo::rank(info1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4," != ");
    iVar1 = ser::DataFieldInfo::rank(info2);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar1);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  iVar1 = ser::DataFieldInfo::bytesPerElement(info1);
  iVar2 = ser::DataFieldInfo::bytesPerElement(info2);
  if (iVar1 != iVar2) {
    local_19 = false;
    poVar4 = std::operator<<((ostream *)&std::cout,"Bytes per Element: ");
    iVar1 = ser::DataFieldInfo::bytesPerElement(info1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4," != ");
    iVar1 = ser::DataFieldInfo::bytesPerElement(info2);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar1);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  iVar1 = ser::DataFieldInfo::iSize(info1);
  iVar2 = ser::DataFieldInfo::iSize(info2);
  if (iVar1 != iVar2) {
    local_19 = false;
    poVar4 = std::operator<<((ostream *)&std::cout,"iSize: ");
    iVar1 = ser::DataFieldInfo::iSize(info1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4," != ");
    iVar1 = ser::DataFieldInfo::iSize(info2);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar1);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  iVar1 = ser::DataFieldInfo::jSize(info1);
  iVar2 = ser::DataFieldInfo::jSize(info2);
  if (iVar1 != iVar2) {
    local_19 = false;
    poVar4 = std::operator<<((ostream *)&std::cout,"jSize: ");
    iVar1 = ser::DataFieldInfo::jSize(info1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4," != ");
    iVar1 = ser::DataFieldInfo::jSize(info2);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar1);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  iVar1 = ser::DataFieldInfo::kSize(info1);
  iVar2 = ser::DataFieldInfo::kSize(info2);
  if (iVar1 != iVar2) {
    local_19 = false;
    poVar4 = std::operator<<((ostream *)&std::cout,"kSize: ");
    iVar1 = ser::DataFieldInfo::kSize(info1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4," != ");
    iVar1 = ser::DataFieldInfo::kSize(info2);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar1);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  iVar1 = ser::DataFieldInfo::lSize(info1);
  iVar2 = ser::DataFieldInfo::lSize(info2);
  if (iVar1 != iVar2) {
    local_19 = false;
    poVar4 = std::operator<<((ostream *)&std::cout,"lSize: ");
    iVar1 = ser::DataFieldInfo::lSize(info1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4," != ");
    iVar1 = ser::DataFieldInfo::lSize(info2);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar1);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  return local_19;
}

Assistant:

bool compareInfo(const DataFieldInfo& info1, const DataFieldInfo& info2)
{
    bool equal = true;
    if (info1.type() != info2.type()) {
        equal = false;
        std::cout << "Type: " << info1.type() << " != " << info2.type() << std::endl;
    }
    if (info1.rank() != info2.rank()) {
        equal = false;
        std::cout << "Rank: " << info1.rank() << " != " << info2.rank() << std::endl;
    }
    if (info1.bytesPerElement() != info2.bytesPerElement()) {
        equal = false;
        std::cout << "Bytes per Element: " << info1.bytesPerElement() << " != " << info2.bytesPerElement() << std::endl;
    }
    if (info1.iSize() != info2.iSize()) {
        equal = false;
        std::cout << "iSize: " << info1.iSize() << " != " << info2.iSize() << std::endl;
    }
    if (info1.jSize() != info2.jSize()) {
        equal = false;
        std::cout << "jSize: " << info1.jSize() << " != " << info2.jSize() << std::endl;
    }
    if (info1.kSize() != info2.kSize()) {
        equal = false;
        std::cout << "kSize: " << info1.kSize() << " != " << info2.kSize() << std::endl;
    }
    if (info1.lSize() != info2.lSize()) {
        equal = false;
        std::cout << "lSize: " << info1.lSize() << " != " << info2.lSize() << std::endl;
    }

    return equal;
}